

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O1

void __thiscall
draco::RAnsSymbolEncoder<16>::EndEncoding(RAnsSymbolEncoder<16> *this,EncoderBuffer *buffer)

{
  uint uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint8_t *puVar4;
  void *pvVar5;
  uint8_t uVar6;
  byte bVar8;
  int iVar7;
  long lVar9;
  unsigned_long val;
  ulong __n;
  pointer pcVar10;
  EncoderBuffer var_size_buffer;
  EncoderBuffer local_60;
  
  pcVar10 = (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = this->buffer_offset_;
  uVar2 = (this->ans_).ans_.state;
  uVar1 = uVar2 - 0x400000;
  uVar6 = (uint8_t)uVar2;
  if (uVar1 < 0x40) {
    (this->ans_).ans_.buf[(this->ans_).ans_.buf_offset] = uVar6;
    iVar7 = (this->ans_).ans_.buf_offset + 1;
  }
  else {
    bVar8 = (byte)(uVar2 >> 8);
    if (uVar1 < 0x4000) {
      puVar4 = (this->ans_).ans_.buf;
      lVar9 = (long)(this->ans_).ans_.buf_offset;
      puVar4[lVar9] = uVar6;
      puVar4[lVar9 + 1] = bVar8 | 0x40;
      iVar7 = (this->ans_).ans_.buf_offset + 2;
    }
    else if (uVar1 < 0x400000) {
      puVar4 = (this->ans_).ans_.buf;
      lVar9 = (long)(this->ans_).ans_.buf_offset;
      puVar4[lVar9] = uVar6;
      puVar4[lVar9 + 1] = bVar8;
      puVar4[lVar9 + 2] = (uint8_t)(uVar2 + 0x400000 >> 0x10);
      iVar7 = (this->ans_).ans_.buf_offset + 3;
    }
    else if (uVar1 < 0x40000000) {
      puVar4 = (this->ans_).ans_.buf;
      lVar9 = (long)(this->ans_).ans_.buf_offset;
      puVar4[lVar9] = uVar6;
      puVar4[lVar9 + 1] = bVar8;
      puVar4[lVar9 + 2] = (uint8_t)(uVar2 + 0xbfc00000 >> 0x10);
      puVar4[lVar9 + 3] = (uint8_t)(uVar2 + 0xbfc00000 >> 0x18);
      iVar7 = (this->ans_).ans_.buf_offset + 4;
    }
    else {
      iVar7 = (this->ans_).ans_.buf_offset;
    }
  }
  val = (unsigned_long)iVar7;
  EncoderBuffer::EncoderBuffer(&local_60);
  EncodeVarint<unsigned_long>(val,&local_60);
  pcVar10 = pcVar10 + uVar3;
  __n = (ulong)(uint)((int)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (int)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  memmove(pcVar10 + __n,pcVar10,val);
  memcpy(pcVar10,(void *)CONCAT44(local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_60.buffer_.
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start),__n);
  EncoderBuffer::Resize(buffer,__n + val + this->buffer_offset_);
  if (local_60.bit_encoder_._M_t.
      super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
      .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
       )0x0) {
    operator_delete((void *)local_60.bit_encoder_._M_t.
                            super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                            .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>.
                            _M_head_impl,0x10);
  }
  local_60.bit_encoder_._M_t.
  super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl =
       (__uniq_ptr_data<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>,_true,_true>
        )(__uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
          )0x0;
  pvVar5 = (void *)CONCAT44(local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl
                            .super__Vector_impl_data._M_start._4_4_,
                            (int)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  return;
}

Assistant:

void RAnsSymbolEncoder<unique_symbols_bit_length_t>::EndEncoding(
    EncoderBuffer *buffer) {
  char *const src = const_cast<char *>(buffer->data()) + buffer_offset_;

  // TODO(fgalligan): Look into changing this to uint32_t as write_end()
  // returns an int.
  const uint64_t bytes_written = static_cast<uint64_t>(ans_.write_end());
  EncoderBuffer var_size_buffer;
  EncodeVarint(bytes_written, &var_size_buffer);
  const uint32_t size_len = static_cast<uint32_t>(var_size_buffer.size());
  char *const dst = src + size_len;
  memmove(dst, src, bytes_written);

  // Store the size of the encoded data.
  memcpy(src, var_size_buffer.data(), size_len);

  // Resize the buffer to match the number of encoded bytes.
  buffer->Resize(buffer_offset_ + bytes_written + size_len);
}